

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O0

_Bool run_container_iterate64
                (run_container_t *cont,uint32_t base,roaring_iterator64 iterator,uint64_t high_bits,
                void *ptr)

{
  ushort uVar1;
  ushort uVar2;
  ulong uVar3;
  ulong in_RCX;
  code *in_RDX;
  int in_ESI;
  int *in_RDI;
  undefined8 in_R8;
  int j;
  uint16_t le;
  uint32_t run_start;
  int i;
  int local_40;
  int local_34;
  
  local_34 = 0;
  do {
    if (*in_RDI <= local_34) {
      return true;
    }
    uVar1 = *(ushort *)(*(long *)(in_RDI + 2) + (long)local_34 * 4);
    uVar2 = *(ushort *)(*(long *)(in_RDI + 2) + 2 + (long)local_34 * 4);
    for (local_40 = 0; local_40 <= (int)(uint)uVar2; local_40 = local_40 + 1) {
      uVar3 = (*in_RDX)(in_RCX | in_ESI + (uint)uVar1 + local_40,in_R8);
      if ((uVar3 & 1) == 0) {
        return false;
      }
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

bool run_container_iterate64(const run_container_t *cont, uint32_t base,
                             roaring_iterator64 iterator, uint64_t high_bits,
                             void *ptr) {
    for (int i = 0; i < cont->n_runs; ++i) {
        uint32_t run_start = base + cont->runs[i].value;
        uint16_t le = cont->runs[i].length;

        for (int j = 0; j <= le; ++j)
            if (!iterator(high_bits | (uint64_t)(run_start + j), ptr))
                return false;
    }
    return true;
}